

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O0

result * __thiscall
baryonyx::itm::
solve_or_optimize<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb,bool is_optimization)

{
  bool is_optimization_local;
  problem *pb_local;
  context *ctx_local;
  
  if (((byte)this[0xf0] & 1) == 0) {
    if (((ulong)pb & 1) == 0) {
      solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                (__return_storage_ptr__,this,ctx,(problem *)__return_storage_ptr__);
    }
    else {
      optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
                (__return_storage_ptr__,this,ctx,(problem *)__return_storage_ptr__);
    }
  }
  else if (((ulong)pb & 1) == 0) {
    solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
              (__return_storage_ptr__,this,ctx,(problem *)__return_storage_ptr__);
  }
  else {
    optimize_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>
              (__return_storage_ptr__,this,ctx,(problem *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static result
solve_or_optimize(const context& ctx, const problem& pb, bool is_optimization)
{
    if (ctx.parameters.debug) {
        using Solver = solver_inequalities_Zcoeff<Float, Mode, Cost, true>;

        return is_optimization
                 ? optimize_problem<Solver, Float, Mode, Cost>(ctx, pb)
                 : solve_problem<Solver, Float, Mode, Cost>(ctx, pb);
    } else {
        using Solver = solver_inequalities_Zcoeff<Float, Mode, Cost, false>;

        return is_optimization
                 ? optimize_problem<Solver, Float, Mode, Cost>(ctx, pb)
                 : solve_problem<Solver, Float, Mode, Cost>(ctx, pb);
    }
}